

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

bool __thiscall
BattleWithLandlord::Str2CardStyle(BattleWithLandlord *this,string *str,CardStyle *style)

{
  multiset<char,_std::less<char>,_std::allocator<char>_> *this_00;
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  mapped_type *__v;
  bool bVar5;
  BattleWithLandlord *this_01;
  pointer pCVar6;
  size_type sVar7;
  string *__range1;
  vector<CardStyle,_std::allocator<CardStyle>_> res;
  char x;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  vector<CardStyle,_std::allocator<CardStyle>_> local_120;
  CardStyle local_108;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_c8;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_98;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_68;
  
  if (((str->_M_string_length == 0) ||
      (iVar4 = std::__cxx11::string::compare((char *)str), iVar4 == 0)) ||
     (iVar4 = std::__cxx11::string::compare((char *)str), iVar4 == 0)) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    CardStyle::CardStyle
              (&local_108,PASS,0,(multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_68
               ,1,0);
    style->type = local_108.type;
    style->id = local_108.id;
    style->len = local_108.len;
    style->carry = local_108.carry;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::clear
              (&(style->pattern)._M_t);
    if (local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
    {
      p_Var1 = &local_108.pattern._M_t._M_impl.super__Rb_tree_header;
      (style->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      (style->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (style->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (style->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(style->pattern)._M_t._M_impl.super__Rb_tree_header._M_header;
      (style->pattern)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_108.pattern._M_t);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&local_68);
    return true;
  }
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar2 = str->_M_string_length;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      local_108.type._0_1_ = pcVar3[sVar7];
      __v = std::__detail::
            _Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<char,_std::pair<const_char,_char>,_std::allocator<std::pair<const_char,_char>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&local_108);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_c8,__v);
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = (BattleWithLandlord *)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  CardStyle::CardStyle
            (&local_108,PASS,0,(multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_98,1
             ,0);
  GenStrategy(&local_120,this_01,(multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_c8
              ,&local_108);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_108.pattern._M_t);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_98);
  if (local_120.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_120.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = &local_108.pattern;
    pCVar6 = local_120.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_108.type = pCVar6->type;
      local_108.id = pCVar6->id;
      local_108.len = pCVar6->len;
      local_108.carry = pCVar6->carry;
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      _Rb_tree(&this_00->_M_t,&(pCVar6->pattern)._M_t);
      if (local_108.pattern._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          str->_M_string_length) {
        style->type = local_108.type;
        style->id = local_108.id;
        style->len = local_108.len;
        style->carry = local_108.carry;
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        operator=(&(style->pattern)._M_t,&this_00->_M_t);
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree(&this_00->_M_t);
        bVar5 = true;
        goto LAB_00107f61;
      }
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&this_00->_M_t);
      pCVar6 = pCVar6 + 1;
    } while (pCVar6 != local_120.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  bVar5 = false;
LAB_00107f61:
  std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector(&local_120);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_c8);
  return bVar5;
}

Assistant:

bool BattleWithLandlord::Str2CardStyle(const string &str, CardStyle &style) {
    if (str.empty() || str == "" || str == "pass") {
        style = CardStyle();
        return true;
    }

    multiset<byte> ms;
    for (auto x: str) {
        ms.insert(_name2id[x]);
    }
    auto res = GenStrategy(ms, CardStyle());
    for (auto x: res) {
        if (x.pattern.size() == str.size()) {
            style = x;
            return true;
        }
    }
    return false;
}